

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void embree::SceneGraph::set_time_range(Ref<embree::SceneGraph::Node> *node,BBox1f *time_range)

{
  Node *pNVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Ref<embree::SceneGraph::Node> local_30;
  
  pNVar1 = node->ptr;
  if (pNVar1 != (Node *)0x0) {
    plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TransformNode::typeinfo,0);
    if (plVar2 == (long *)0x0) {
      plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
      if (plVar2 == (long *)0x0) {
        plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GroupNode::typeinfo,0);
        if (plVar2 == (long *)0x0) {
          plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
          if (plVar2 == (long *)0x0) {
            plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
            if (plVar2 == (long *)0x0) {
              plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&GridMeshNode::typeinfo,0);
              if (plVar2 == (long *)0x0) {
                plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&HairSetNode::typeinfo,0);
                if (plVar2 == (long *)0x0) {
                  plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&PointSetNode::typeinfo,0);
                  if (plVar2 == (long *)0x0) {
                    plVar2 = (long *)__dynamic_cast(pNVar1,&Node::typeinfo,&SubdivMeshNode::typeinfo
                                                    ,0);
                    if (plVar2 != (long *)0x0) {
                      (**(code **)(*plVar2 + 0x10))(plVar2);
                      *(float *)(plVar2 + 0xd) = time_range->lower;
                      *(float *)((long)plVar2 + 0x6c) = time_range->upper;
                      (**(code **)(*plVar2 + 0x18))(plVar2);
                    }
                  }
                  else {
                    (**(code **)(*plVar2 + 0x10))(plVar2);
                    *(float *)(plVar2 + 0xd) = time_range->lower;
                    *(float *)((long)plVar2 + 0x6c) = time_range->upper;
                    (**(code **)(*plVar2 + 0x18))(plVar2);
                  }
                }
                else {
                  (**(code **)(*plVar2 + 0x10))(plVar2);
                  *(float *)(plVar2 + 0xd) = time_range->lower;
                  *(float *)((long)plVar2 + 0x6c) = time_range->upper;
                  (**(code **)(*plVar2 + 0x18))(plVar2);
                }
              }
              else {
                (**(code **)(*plVar2 + 0x10))(plVar2);
                *(float *)(plVar2 + 0xd) = time_range->lower;
                *(float *)((long)plVar2 + 0x6c) = time_range->upper;
                (**(code **)(*plVar2 + 0x18))(plVar2);
              }
            }
            else {
              (**(code **)(*plVar2 + 0x10))(plVar2);
              *(float *)(plVar2 + 0xd) = time_range->lower;
              *(float *)((long)plVar2 + 0x6c) = time_range->upper;
              (**(code **)(*plVar2 + 0x18))(plVar2);
            }
          }
          else {
            (**(code **)(*plVar2 + 0x10))(plVar2);
            *(float *)(plVar2 + 0xd) = time_range->lower;
            *(float *)((long)plVar2 + 0x6c) = time_range->upper;
            (**(code **)(*plVar2 + 0x18))(plVar2);
          }
        }
        else {
          (**(code **)(*plVar2 + 0x10))(plVar2);
          lVar3 = plVar2[0xd];
          if (plVar2[0xe] != lVar3) {
            uVar5 = 0;
            do {
              pNVar1 = *(Node **)(lVar3 + uVar5 * 8);
              local_30.ptr = pNVar1;
              if (pNVar1 != (Node *)0x0) {
                (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
              }
              set_time_range(&local_30,time_range);
              if (pNVar1 != (Node *)0x0) {
                (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
              }
              uVar5 = uVar5 + 1;
              lVar3 = plVar2[0xd];
            } while (uVar5 < (ulong)(plVar2[0xe] - lVar3 >> 3));
          }
          (**(code **)(*plVar2 + 0x18))(plVar2);
        }
      }
      else {
        (**(code **)(*plVar2 + 0x10))(plVar2);
        lVar3 = plVar2[0xd];
        if (plVar2[0xe] != lVar3) {
          lVar4 = 4;
          uVar5 = 0;
          do {
            *(float *)(lVar3 + -4 + lVar4) = time_range->lower;
            *(float *)(lVar3 + lVar4) = time_range->upper;
            uVar5 = uVar5 + 1;
            lVar3 = plVar2[0xd];
            lVar4 = lVar4 + 0x30;
          } while (uVar5 < (ulong)((plVar2[0xe] - lVar3 >> 4) * -0x5555555555555555));
        }
        (**(code **)(*plVar2 + 0x18))(plVar2);
      }
    }
    else {
      (**(code **)(*plVar2 + 0x10))(plVar2);
      *(float *)(plVar2 + 0xd) = time_range->lower;
      *(float *)((long)plVar2 + 0x6c) = time_range->upper;
      (**(code **)(*plVar2 + 0x18))(plVar2);
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::print(std::ostream& cout, int depth) {
    cout << "HairSetNode @ " << this << " { closed = " << closed << " }" << std::endl;
  }